

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

int main(void)

{
  char local_a [2];
  
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"int",3);
  local_a[0] = ' ';
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,local_a,1);
  local_a[1] = 10;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,local_a + 1,1);
  return 0;
}

Assistant:

int
main()
{
    std::cout << myspace::type_name_array_holder::value
                     [type_description_holder::value.type_index]
              << ' ';

    for(auto i = 0ul; i < type_description_holder::value.num_attributes; ++i)
    {
        auto att = type_description_holder::value.attributes[i];
        if(att == shadow::type_attribute::const_tag)
        {
            std::cout << "const ";
        }
        else if(att == shadow::type_attribute::lreference_tag)
        {
            std::cout << "& ";
        }
        else if(att == shadow::type_attribute::pointer_tag)
        {
            std::cout << "* ";
        }
        else
        {
            std::cout << '[' << att << "] ";
        }

    }

    std::cout << '\n';
}